

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::Parser::ParseUserDefinedType(Parser *this,string *type_name)

{
  bool bVar1;
  bool bVar2;
  const_iterator cVar3;
  string identifier;
  allocator local_51;
  string local_50;
  
  type_name->_M_string_length = 0;
  *(type_name->_M_dataplus)._M_p = '\0';
  cVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::FieldDescriptorProto_Type>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::FieldDescriptorProto_Type>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::FieldDescriptorProto_Type>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::FieldDescriptorProto_Type>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)(anonymous_namespace)::kTypeNames_abi_cxx11_,&(this->input_->current_).text);
  if (cVar3.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::FieldDescriptorProto_Type>,_true>
      ._M_cur == (__node_type *)0x0) {
    bVar1 = TryConsume(this,".");
    if (bVar1) {
      std::__cxx11::string::append((char *)type_name);
    }
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    local_50._M_string_length = 0;
    local_50.field_2._M_local_buf[0] = '\0';
    bVar1 = ConsumeIdentifier(this,&local_50,"Expected type name.");
    if (bVar1) {
      std::__cxx11::string::append((string *)type_name);
      while( true ) {
        bVar1 = TryConsume(this,".");
        if (!bVar1) break;
        std::__cxx11::string::append((char *)type_name);
        bVar2 = ConsumeIdentifier(this,&local_50,"Expected identifier.");
        if (!bVar2) break;
        std::__cxx11::string::append((string *)type_name);
      }
      bVar1 = !bVar1;
    }
    else {
      bVar1 = false;
    }
    std::__cxx11::string::~string((string *)&local_50);
  }
  else {
    std::__cxx11::string::string((string *)&local_50,"Expected message type.",&local_51);
    AddError(this,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::_M_assign((string *)type_name);
    io::Tokenizer::Next(this->input_);
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool Parser::ParseUserDefinedType(std::string* type_name) {
  type_name->clear();

  TypeNameMap::const_iterator iter = kTypeNames.find(input_->current().text);
  if (iter != kTypeNames.end()) {
    // Note:  The only place enum types are allowed is for field types, but
    //   if we are parsing a field type then we would not get here because
    //   primitives are allowed there as well.  So this error message doesn't
    //   need to account for enums.
    AddError("Expected message type.");

    // Pretend to accept this type so that we can go on parsing.
    *type_name = input_->current().text;
    input_->Next();
    return true;
  }

  // A leading "." means the name is fully-qualified.
  if (TryConsume(".")) type_name->append(".");

  // Consume the first part of the name.
  std::string identifier;
  DO(ConsumeIdentifier(&identifier, "Expected type name."));
  type_name->append(identifier);

  // Consume more parts.
  while (TryConsume(".")) {
    type_name->append(".");
    DO(ConsumeIdentifier(&identifier, "Expected identifier."));
    type_name->append(identifier);
  }

  return true;
}